

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  exception *e;
  
  testPrimes();
  testGFConstruct();
  testGFMath();
  return 0;
}

Assistant:

int main(int argc, const char *argv[])
{
    try
    {
        testPrimes();
        testGFConstruct();
        testGFMath();
    }
    catch (const exception &e)
    {
        cout << endl
             << e.what();
        return EXIT_FAILURE;
    }

    return EXIT_SUCCESS;
}